

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplaceRealloc<slang::ast::DefinitionSymbol::ParameterDecl_const&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,pointer pos,
          ParameterDecl *args)

{
  size_t *psVar1;
  SourceLocation *pSVar2;
  ulong uVar3;
  pointer p;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar4;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 aVar5;
  size_t sVar6;
  char *pcVar7;
  SourceLocation SVar8;
  SourceLocation SVar9;
  size_t sVar10;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar11;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar12;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar13;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar14;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar15;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar16;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar17;
  pointer pPVar18;
  long lVar19;
  long lVar20;
  size_type sVar21;
  ulong uVar22;
  
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar22 = this->len + 1;
  uVar3 = this->cap;
  if (uVar22 < uVar3 * 2) {
    uVar22 = uVar3 * 2;
  }
  if (0x1ffffffffffffff - uVar3 < uVar3) {
    uVar22 = 0x1ffffffffffffff;
  }
  lVar20 = (long)pos - (long)this->data_;
  paVar16 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)operator_new(uVar22 << 6);
  aVar4 = args->field_0;
  aVar5 = args->field_1;
  sVar6 = (args->name)._M_len;
  pcVar7 = (args->name)._M_str;
  SVar8 = args->location;
  SVar9 = (SourceLocation)(args->attributes)._M_ptr;
  sVar10 = *(size_t *)&args->isTypeParam;
  psVar1 = (size_t *)((long)paVar16 + lVar20 + 0x30);
  *psVar1 = (args->attributes)._M_extent._M_extent_value;
  psVar1[1] = sVar10;
  pSVar2 = (SourceLocation *)((long)paVar16 + lVar20 + 0x20);
  *pSVar2 = SVar8;
  pSVar2[1] = SVar9;
  psVar1 = (size_t *)((long)paVar16 + lVar20 + 0x10);
  *psVar1 = sVar6;
  psVar1[1] = (size_t)pcVar7;
  *(anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar16 + lVar20) = aVar4;
  *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)
   ((anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar16 + lVar20) + 1) = aVar5;
  p = this->data_;
  sVar21 = this->len;
  lVar19 = (long)p + (sVar21 * 0x40 - (long)pos);
  pPVar18 = p;
  paVar17 = paVar16;
  if (lVar19 == 0) {
    if (sVar21 != 0) {
      do {
        aVar4 = pPVar18->field_0;
        aVar5 = pPVar18->field_1;
        aVar11 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar18->name)._M_len;
        aVar12 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar18->name)._M_str;
        aVar13 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar18->location;
        aVar14 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar18->attributes)._M_ptr;
        aVar15 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar18->isTypeParam;
        paVar17[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                     (pPVar18->attributes)._M_extent._M_extent_value;
        paVar17[7] = aVar15;
        paVar17[4] = aVar13;
        paVar17[5] = aVar14;
        paVar17[2] = aVar11;
        paVar17[3] = aVar12;
        *paVar17 = aVar4;
        *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar17 + 1) = aVar5;
        pPVar18 = pPVar18 + 1;
        paVar17 = paVar17 + 8;
      } while (pPVar18 != pos);
    }
  }
  else {
    for (; pPVar18 != pos; pPVar18 = pPVar18 + 1) {
      aVar4 = pPVar18->field_0;
      aVar5 = pPVar18->field_1;
      aVar11 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar18->name)._M_len;
      aVar12 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar18->name)._M_str;
      aVar13 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar18->location;
      aVar14 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar18->attributes)._M_ptr;
      aVar15 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar18->isTypeParam;
      paVar17[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                   (pPVar18->attributes)._M_extent._M_extent_value;
      paVar17[7] = aVar15;
      paVar17[4] = aVar13;
      paVar17[5] = aVar14;
      paVar17[2] = aVar11;
      paVar17[3] = aVar12;
      *paVar17 = aVar4;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar17 + 1) = aVar5;
      paVar17 = paVar17 + 8;
    }
    memcpy((void *)((long)paVar16 + lVar20 + 0x40),pos,(lVar19 - 0x40U & 0xffffffffffffffc0) + 0x40)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar21 = this->len;
  }
  this->len = sVar21 + 1;
  this->cap = uVar22;
  this->data_ = (pointer)paVar16;
  return (pointer)((long)paVar16 + lVar20);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}